

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Operation>::InternalSwap
          (RepeatedPtrField<CoreML::Specification::MILSpec::Operation> *this,
          RepeatedPtrField<CoreML::Specification::MILSpec::Operation> *other)

{
  RepeatedPtrField<CoreML::Specification::MILSpec::Operation> *other_local;
  RepeatedPtrField<CoreML::Specification::MILSpec::Operation> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }